

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O1

int xmlDOMWrapAdoptNode(xmlDOMWrapCtxtPtr_conflict ctxt,xmlDocPtr sourceDoc,xmlNodePtr node,
                       xmlDocPtr destDoc,xmlNodePtr destParent,int options)

{
  xmlElementType xVar1;
  int iVar2;
  xmlChar *pxVar3;
  xmlEntityPtr pxVar4;
  xmlChar *pxVar5;
  xmlNodePtr destParent_00;
  _xmlDoc *sourceDoc_00;
  xmlChar *old;
  bool bVar6;
  
  if (node == (xmlNodePtr)0x0) {
    return -1;
  }
  xVar1 = node->type;
  if (destDoc == (xmlDocPtr)0x0 || xVar1 == XML_NAMESPACE_DECL) {
    return -1;
  }
  if ((destParent != (xmlNodePtr)0x0) && (destParent->doc != destDoc)) {
    return -1;
  }
  sourceDoc_00 = node->doc;
  if (((sourceDoc_00 != sourceDoc) && (sourceDoc != (xmlDocPtr)0x0)) &&
     (sourceDoc_00 != (_xmlDoc *)0x0)) {
    return -1;
  }
  if (sourceDoc != (xmlDocPtr)0x0) {
    sourceDoc_00 = sourceDoc;
  }
  if (sourceDoc_00 == destDoc) {
    return -1;
  }
  if (xVar1 < XML_NOTATION_NODE) {
    if ((0x1beU >> (xVar1 & (XML_ATTRIBUTE_DECL|XML_ELEMENT_DECL)) & 1) != 0) {
      destParent_00 = destParent;
      if (node->parent != destParent && node->parent != (_xmlNode *)0x0) {
        xmlUnlinkNode(node);
      }
      xVar1 = node->type;
      if (xVar1 == XML_ATTRIBUTE_NODE) {
        iVar2 = xmlDOMWrapAdoptAttr((xmlDOMWrapCtxtPtr_conflict)sourceDoc_00,(xmlDocPtr)node,
                                    (xmlAttrPtr)destDoc,(xmlDocPtr)destParent,destParent_00,options)
        ;
        return iVar2;
      }
      if (xVar1 == XML_ELEMENT_NODE) {
        iVar2 = xmlDOMWrapAdoptBranch(ctxt,sourceDoc_00,node,destDoc,destParent,options);
        return iVar2;
      }
      node->doc = destDoc;
      if (sourceDoc_00 == (xmlDocPtr)0x0) {
        bVar6 = false;
      }
      else {
        bVar6 = sourceDoc_00->dict == destDoc->dict;
      }
      if (1 < xVar1 - XML_TEXT_NODE) {
        if (xVar1 == XML_ENTITY_REF_NODE) {
          node->content = (xmlChar *)0x0;
          node->children = (_xmlNode *)0x0;
          node->last = (_xmlNode *)0x0;
          if (((destDoc->intSubset != (_xmlDtd *)0x0) || (destDoc->extSubset != (_xmlDtd *)0x0)) &&
             (pxVar4 = xmlGetDocEntity(destDoc,node->name), pxVar4 != (xmlEntityPtr)0x0)) {
            node->content = pxVar4->content;
            node->children = (_xmlNode *)pxVar4;
            node->last = (_xmlNode *)pxVar4;
          }
          if (bVar6) {
            return 0;
          }
          pxVar5 = node->name;
          if (pxVar5 == (xmlChar *)0x0) {
            return 0;
          }
          if (destDoc->dict != (xmlDictPtr)0x0) {
            pxVar3 = xmlDictLookup(destDoc->dict,pxVar5,-1);
            node->name = pxVar3;
            if (((sourceDoc_00 != (xmlDocPtr)0x0) && (sourceDoc_00->dict != (xmlDictPtr)0x0)) &&
               (iVar2 = xmlDictOwns(sourceDoc_00->dict,pxVar5), iVar2 != 0)) {
              return 0;
            }
            (*xmlFree)(pxVar5);
            return 0;
          }
          if (sourceDoc_00 == (xmlDocPtr)0x0) {
            return 0;
          }
          if (sourceDoc_00->dict == (xmlDictPtr)0x0) {
            return 0;
          }
          iVar2 = xmlDictOwns(sourceDoc_00->dict,pxVar5);
          if (iVar2 == 0) {
            return 0;
          }
          pxVar5 = xmlStrdup(node->name);
          node->name = pxVar5;
          return 0;
        }
        if (xVar1 != XML_PI_NODE) {
          return 0;
        }
        if (bVar6) {
          return 0;
        }
        pxVar5 = node->name;
        if (pxVar5 != (xmlChar *)0x0) {
          if (destDoc->dict == (xmlDictPtr)0x0) {
            if (((sourceDoc_00 != (xmlDocPtr)0x0) && (sourceDoc_00->dict != (xmlDictPtr)0x0)) &&
               (iVar2 = xmlDictOwns(sourceDoc_00->dict,pxVar5), iVar2 != 0)) {
              pxVar5 = xmlStrdup(node->name);
              node->name = pxVar5;
            }
          }
          else {
            pxVar3 = xmlDictLookup(destDoc->dict,pxVar5,-1);
            node->name = pxVar3;
            if (((sourceDoc_00 == (xmlDocPtr)0x0) || (sourceDoc_00->dict == (xmlDictPtr)0x0)) ||
               (iVar2 = xmlDictOwns(sourceDoc_00->dict,pxVar5), iVar2 == 0)) {
              (*xmlFree)(pxVar5);
            }
          }
        }
      }
      if (bVar6) {
        return 0;
      }
      if (node->content == (xmlChar *)0x0 || sourceDoc_00 == (xmlDocPtr)0x0) {
        return 0;
      }
      if (sourceDoc_00->dict == (xmlDictPtr)0x0) {
        return 0;
      }
      iVar2 = xmlDictOwns(sourceDoc_00->dict,node->content);
      if (iVar2 == 0) {
        return 0;
      }
      if (destDoc->dict == (xmlDictPtr)0x0) {
        pxVar5 = xmlStrdup(node->content);
      }
      else {
        pxVar5 = xmlDictLookup(destDoc->dict,node->content,-1);
      }
      node->content = pxVar5;
      return 0;
    }
    if (xVar1 == XML_DOCUMENT_FRAG_NODE) {
      return 2;
    }
  }
  return 1;
}

Assistant:

int
xmlDOMWrapAdoptNode(xmlDOMWrapCtxtPtr ctxt,
		    xmlDocPtr sourceDoc,
		    xmlNodePtr node,
		    xmlDocPtr destDoc,
		    xmlNodePtr destParent,
		    int options)
{
    if ((node == NULL) || (node->type == XML_NAMESPACE_DECL) ||
        (destDoc == NULL) ||
	((destParent != NULL) && (destParent->doc != destDoc)))
	return(-1);
    /*
    * Check node->doc sanity.
    */
    if ((node->doc != NULL) && (sourceDoc != NULL) &&
	(node->doc != sourceDoc)) {
	/*
	* Might be an XIncluded node.
	*/
	return (-1);
    }
    if (sourceDoc == NULL)
	sourceDoc = node->doc;
    if (sourceDoc == destDoc)
	return (-1);
    switch (node->type) {
	case XML_ELEMENT_NODE:
	case XML_ATTRIBUTE_NODE:
	case XML_TEXT_NODE:
	case XML_CDATA_SECTION_NODE:
	case XML_ENTITY_REF_NODE:
	case XML_PI_NODE:
	case XML_COMMENT_NODE:
	    break;
	case XML_DOCUMENT_FRAG_NODE:
	    /* TODO: Support document-fragment-nodes. */
	    return (2);
	default:
	    return (1);
    }
    /*
    * Unlink only if @node was not already added to @destParent.
    */
    if ((node->parent != NULL) && (destParent != node->parent))
	xmlUnlinkNode(node);

    if (node->type == XML_ELEMENT_NODE) {
	    return (xmlDOMWrapAdoptBranch(ctxt, sourceDoc, node,
		    destDoc, destParent, options));
    } else if (node->type == XML_ATTRIBUTE_NODE) {
	    return (xmlDOMWrapAdoptAttr(ctxt, sourceDoc,
		(xmlAttrPtr) node, destDoc, destParent, options));
    } else {
	xmlNodePtr cur = node;
	int adoptStr = 1;

	cur->doc = destDoc;
	/*
	* Optimize string adoption.
	*/
	if ((sourceDoc != NULL) &&
	    (sourceDoc->dict == destDoc->dict))
		adoptStr = 0;
	switch (node->type) {
	    case XML_TEXT_NODE:
	    case XML_CDATA_SECTION_NODE:
		XML_TREE_ADOPT_STR_2(node->content)
		    break;
	    case XML_ENTITY_REF_NODE:
		/*
		* Remove reference to the entity-node.
		*/
		node->content = NULL;
		node->children = NULL;
		node->last = NULL;
		if ((destDoc->intSubset) || (destDoc->extSubset)) {
		    xmlEntityPtr ent;
		    /*
		    * Assign new entity-node if available.
		    */
		    ent = xmlGetDocEntity(destDoc, node->name);
		    if (ent != NULL) {
			node->content = ent->content;
			node->children = (xmlNodePtr) ent;
			node->last = (xmlNodePtr) ent;
		    }
		}
		XML_TREE_ADOPT_STR(node->name)
		break;
	    case XML_PI_NODE: {
		XML_TREE_ADOPT_STR(node->name)
		XML_TREE_ADOPT_STR_2(node->content)
		break;
	    }
	    default:
		break;
	}
    }
    return (0);
}